

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int *piVar1;
  ostream *poVar2;
  bool bVar3;
  list_iterator local_d0;
  list_iterator local_c8;
  list_iterator local_c0;
  list_iterator local_b8;
  list_iterator local_b0;
  list_iterator local_a8;
  list_iterator local_a0;
  list_iterator local_98;
  list_iterator local_90;
  list_iterator local_88;
  list_iterator local_80;
  list_iterator local_78;
  list_iterator local_70;
  iterator it;
  int local_60 [2];
  undefined1 local_58 [8];
  list<int> y;
  int local_40;
  int local_3c;
  int local_38;
  int local_24;
  undefined1 local_20 [8];
  list<int> l;
  
  l.mSize._4_4_ = 0;
  CP::list<int>::list((list<int> *)local_20);
  local_24 = 9;
  CP::list<int>::push_back((list<int> *)local_20,&local_24);
  local_38 = 2;
  CP::list<int>::push_back((list<int> *)local_20,&stack0xffffffffffffffc8);
  local_3c = 2;
  CP::list<int>::push_back((list<int> *)local_20,&stack0xffffffffffffffc4);
  local_40 = 4;
  CP::list<int>::push_back((list<int> *)local_20,&stack0xffffffffffffffc0);
  y.mSize._4_4_ = 2;
  CP::list<int>::push_back((list<int> *)local_20,(int *)((long)&y.mSize + 4));
  y.mSize._0_4_ = 7;
  CP::list<int>::push_back((list<int> *)local_20,(int *)&y.mSize);
  CP::list<int>::list((list<int> *)local_58);
  local_60[1] = 3;
  CP::list<int>::push_back((list<int> *)local_58,local_60 + 1);
  local_60[0] = 2;
  CP::list<int>::push_back((list<int> *)local_58,local_60);
  it.ptr._4_4_ = 1;
  CP::list<int>::push_back((list<int> *)local_58,(int *)((long)&it.ptr + 4));
  it.ptr._0_4_ = 2;
  CP::list<int>::replace((list<int> *)local_20,(int *)&it,(list<int> *)local_58);
  local_70.ptr = (node *)CP::list<int>::begin((list<int> *)local_20);
  CP::list<int>::print((list<int> *)local_20);
  local_78 = CP::list<int>::list_iterator::operator++(&local_70,0);
  piVar1 = CP::list<int>::list_iterator::operator*(&local_78);
  bVar3 = false;
  if (*piVar1 == 9) {
    local_80 = CP::list<int>::list_iterator::operator++(&local_70,0);
    piVar1 = CP::list<int>::list_iterator::operator*(&local_80);
    bVar3 = false;
    if (*piVar1 == 3) {
      local_88 = CP::list<int>::list_iterator::operator++(&local_70,0);
      piVar1 = CP::list<int>::list_iterator::operator*(&local_88);
      bVar3 = false;
      if (*piVar1 == 2) {
        local_90 = CP::list<int>::list_iterator::operator++(&local_70,0);
        piVar1 = CP::list<int>::list_iterator::operator*(&local_90);
        bVar3 = false;
        if (*piVar1 == 1) {
          local_98 = CP::list<int>::list_iterator::operator++(&local_70,0);
          piVar1 = CP::list<int>::list_iterator::operator*(&local_98);
          bVar3 = false;
          if (*piVar1 == 3) {
            local_a0 = CP::list<int>::list_iterator::operator++(&local_70,0);
            piVar1 = CP::list<int>::list_iterator::operator*(&local_a0);
            bVar3 = false;
            if (*piVar1 == 2) {
              local_a8 = CP::list<int>::list_iterator::operator++(&local_70,0);
              piVar1 = CP::list<int>::list_iterator::operator*(&local_a8);
              bVar3 = false;
              if (*piVar1 == 1) {
                local_b0 = CP::list<int>::list_iterator::operator++(&local_70,0);
                piVar1 = CP::list<int>::list_iterator::operator*(&local_b0);
                bVar3 = false;
                if (*piVar1 == 4) {
                  local_b8 = CP::list<int>::list_iterator::operator++(&local_70,0);
                  piVar1 = CP::list<int>::list_iterator::operator*(&local_b8);
                  bVar3 = false;
                  if (*piVar1 == 3) {
                    local_c0 = CP::list<int>::list_iterator::operator++(&local_70,0);
                    piVar1 = CP::list<int>::list_iterator::operator*(&local_c0);
                    bVar3 = false;
                    if (*piVar1 == 2) {
                      local_c8 = CP::list<int>::list_iterator::operator++(&local_70,0);
                      piVar1 = CP::list<int>::list_iterator::operator*(&local_c8);
                      bVar3 = false;
                      if (*piVar1 == 1) {
                        local_d0 = CP::list<int>::list_iterator::operator++(&local_70,0);
                        piVar1 = CP::list<int>::list_iterator::operator*(&local_d0);
                        bVar3 = *piVar1 == 7;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (bVar3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Right");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Wrong");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  l.mSize._4_4_ = 0;
  CP::list<int>::~list((list<int> *)local_58);
  CP::list<int>::~list((list<int> *)local_20);
  return l.mSize._4_4_;
}

Assistant:

int main() {
	CP::list<int> l;
	l.push_back(9);
	l.push_back(2);
	l.push_back(2);
	l.push_back(4);
	l.push_back(2);
	l.push_back(7);
	CP::list<int> y;
	y.push_back(3);
	y.push_back(2);
	y.push_back(1);

	l.replace(2, y);
	CP::list<int>::iterator it = l.begin();
	l.print();
	if ((*it++ == 9) && (*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 4) &&
		(*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 7)) {
		std::cout << "Right" << std::endl;
	}
	else {
		std::cout << "Wrong" << std::endl;
	}

	return 0;
}